

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O1

void __thiscall
cfdcapi_common_CfdGetLastErrorMessage_Test::~cfdcapi_common_CfdGetLastErrorMessage_Test
          (cfdcapi_common_CfdGetLastErrorMessage_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdGetLastErrorMessage) {
  int ret = CfdGetLastErrorMessage(NULL, NULL);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);

  char* str_buffer = NULL;
  ret = CfdGetLastErrorMessage(NULL, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  void* handle = NULL;
  ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  ret = CfdGetLastErrorMessage(handle, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_STREQ("", str_buffer);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  cfd::capi::SetLastFatalError(handle, "dummy");
  ret = CfdGetLastErrorMessage(handle, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_STREQ("dummy", str_buffer);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  cfd::capi::SetLastError(handle,
    cfd::core::CfdException(cfd::core::CfdError::kCfdInternalError,
      "dummy_cfdexcept"));
  ret = CfdGetLastErrorMessage(handle, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  ret = CfdGetLastErrorCode(handle);
  EXPECT_EQ(kCfdInternalError, ret);
  EXPECT_STREQ("dummy_cfdexcept", str_buffer);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  cfd::capi::SetLastFatalError(handle, std::runtime_error("dummy_except"));
  ret = CfdGetLastErrorMessage(handle, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  ret = CfdGetLastErrorCode(handle);
  EXPECT_EQ(kCfdUnknownError, ret);
  EXPECT_STREQ("dummy_except", str_buffer);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}